

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O1

int piece_left_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  ushort uVar4;
  Am_Object AStack_18;
  
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)BLACK_PLAYER);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  uVar4 = (ushort)&AStack_18;
  if (bVar1) {
    Am_Object::Get_Object(uVar4,0x10c320);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar4,(ulong)COLUMN);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  }
  else {
    Am_Object::Get_Object(uVar4,0x10c318);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar4,(ulong)COLUMN);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  }
  Am_Object::~Am_Object(&AStack_18);
  return iVar2 * 0x32;
}

Assistant:

Am_Define_Formula(int, piece_left)
{
  int rank = self.Get(Am_RANK);
  bool black_player = self.Get(BLACK_PLAYER);
  int col;

#if 0
  bool visible = self.Get (Am_VISIBLE);
  if (!visible)
    col = -1;  // disappear offscreen
  else
#endif
  if (black_player)
    col = Black_Pieces.Get_Object(piece_slot[rank]).Get(COLUMN);
  else
    col = Red_Pieces.Get_Object(piece_slot[rank]).Get(COLUMN);
  return col * 50;
}